

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O1

int Wln_ObjClone(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  
  if ((-1 < iObj) && (iObj < (p->vTypes).nSize)) {
    if ((p->vSigns).nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    if (iObj < (p->vRanges).nSize) {
      iVar3 = (p->vRanges).pArray[(uint)iObj];
      if (-1 < iVar3) {
        pVVar1 = p->pRanges->vObjs;
        uVar4 = iVar3 * 4;
        if ((int)uVar4 < pVVar1->nSize) {
          piVar2 = pVVar1->pArray;
          iVar3 = Wln_ObjAlloc(pNew,(p->vTypes).pArray[(uint)iObj],
                               (int)(p->vSigns).pArray[(uint)iObj],piVar2[uVar4],
                               piVar2[(ulong)uVar4 + 1]);
          return iVar3;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Wln_ObjClone( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    return Wln_ObjAlloc( pNew, Wln_ObjType(p, iObj), Wln_ObjIsSigned(p, iObj), Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj) );
}